

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O3

void discrete_dist_test_pdf<trng::geometric_dist>(geometric_dist *d)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  double diff;
  AssertionHandler catchAssertionHandler;
  double local_e8;
  double local_d8 [2];
  SourceLineInfo local_c8;
  ITransientExpression local_b8;
  double *local_a8;
  char *local_a0;
  size_t sStack_98;
  double *local_90;
  StringRef local_88;
  AssertionHandler local_78;
  
  local_e8 = 1.0 - (d->P).q_;
  if (local_e8 < 0.95) {
    iVar4 = 0;
    iVar3 = 0;
    do {
      dVar1 = (d->P).q_;
      uVar6 = SUB84(dVar1,0);
      uVar7 = (undefined4)((ulong)dVar1 >> 0x20);
      bVar5 = iVar4 != 0;
      iVar4 = iVar4 + -1;
      if (bVar5) {
        dVar1 = pow(dVar1,(double)iVar3);
        local_e8 = local_e8 + dVar1 + -1.0;
        dVar1 = (d->P).q_;
        uVar6 = SUB84(dVar1,0);
        uVar7 = (undefined4)((ulong)dVar1 >> 0x20);
      }
      dVar1 = (d->P).p_;
      dVar2 = pow((double)CONCAT44(uVar7,uVar6),(double)iVar3);
      local_d8[0] = local_e8 - dVar2 * dVar1;
      local_b8._vptr_ITransientExpression = (_func_int **)0x2a6457;
      local_b8.m_isBinaryExpression = true;
      local_b8.m_result = false;
      local_b8._10_6_ = 0;
      local_c8.file =
           "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
      ;
      local_c8.line = 0xeb;
      Catch::StringRef::StringRef(&local_88,"diff < 128 * std::numeric_limits<double>::epsilon()");
      Catch::AssertionHandler::AssertionHandler
                (&local_78,(StringRef *)&local_b8,&local_c8,local_88,Normal);
      dVar1 = local_d8[0];
      local_d8[1] = 2.842170943040401e-14;
      Catch::StringRef::StringRef((StringRef *)&local_c8,"<");
      local_b8.m_result = dVar1 < 2.842170943040401e-14;
      local_b8.m_isBinaryExpression = true;
      local_b8._vptr_ITransientExpression =
           (_func_int **)&PTR_streamReconstructedExpression_003182f8;
      local_a8 = local_d8;
      local_a0 = local_c8.file;
      sStack_98 = local_c8.line;
      local_90 = local_d8 + 1;
      Catch::AssertionHandler::handleExpr(&local_78,&local_b8);
      Catch::ITransientExpression::~ITransientExpression(&local_b8);
      Catch::AssertionHandler::complete(&local_78);
      if (local_78.m_completed == false) {
        (*(local_78.m_resultCapture)->_vptr_IResultCapture[0xe])(local_78.m_resultCapture,&local_78)
        ;
      }
      local_e8 = pow((d->P).q_,(double)(iVar3 + 2));
      local_e8 = 1.0 - local_e8;
      iVar3 = iVar3 + 1;
    } while (local_e8 < 0.95);
  }
  return;
}

Assistant:

void discrete_dist_test_pdf(dist &d) {
  int i{d.min()};
  double P{d.cdf(i)};
  while (P < 0.95) {
    double p{P};
    if (i > d.min())
      p -= d.cdf(i - 1);
    const double diff{p - d.pdf(i)};
    REQUIRE(diff < 128 * std::numeric_limits<double>::epsilon());
    ++i;
    P = d.cdf(i);
  }
}